

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ArenaStringPtr::Release_abi_cxx11_(ArenaStringPtr *this)

{
  void *pvVar1;
  string *this_00;
  string *psVar2;
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) == 0) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
    if (((ulong)pvVar1 & 1) != 0) {
      this_00 = (string *)operator_new(0x20);
      if (((ulong)pvVar1 & 2) == 0) {
        std::__cxx11::string::string((string *)this_00,(string *)psVar2);
        psVar2 = this_00;
      }
      else {
        std::__cxx11::string::string((string *)this_00,(string *)psVar2);
        psVar2 = this_00;
      }
    }
    (this->tagged_ptr_).ptr_ = &fixed_address_empty_string_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

std::string* ArenaStringPtr::Release() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) return nullptr;

  std::string* released = tagged_ptr_.Get();
  if (tagged_ptr_.IsArena()) {
    released = tagged_ptr_.IsMutable() ? new std::string(std::move(*released))
                                       : new std::string(*released);
  }
  InitDefault();
  return released;
}